

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O3

uint64_t aom_highbd_sse_odd_size(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int w,int h)

{
  uint64_t uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = 0;
  if (0 < h) {
    lVar2 = (long)b * 2;
    lVar4 = (long)a * 2;
    uVar1 = 0;
    do {
      if (0 < w) {
        uVar3 = 0;
        do {
          iVar6 = (uint)*(ushort *)(lVar4 + uVar3 * 2) - (uint)*(ushort *)(lVar2 + uVar3 * 2);
          uVar1 = uVar1 + (uint)(iVar6 * iVar6);
          uVar3 = uVar3 + 1;
        } while ((uint)w != uVar3);
      }
      iVar5 = iVar5 + 1;
      lVar2 = lVar2 + (long)b_stride * 2;
      lVar4 = lVar4 + (long)a_stride * 2;
    } while (iVar5 != h);
    return uVar1;
  }
  return 0;
}

Assistant:

uint64_t aom_highbd_sse_odd_size(const uint8_t *a, int a_stride,
                                 const uint8_t *b, int b_stride, int w, int h) {
  uint64_t sse;
  int64_t sum;
  highbd_variance64(a, a_stride, b, b_stride, w, h, &sse, &sum);
  return sse;
}